

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall
icu_63::MessagePattern::MessagePattern
          (MessagePattern *this,UMessagePatternApostropheMode mode,UErrorCode *errorCode)

{
  UErrorCode *errorCode_local;
  UMessagePatternApostropheMode mode_local;
  MessagePattern *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_004e4b18;
  this->aposMode = mode;
  UnicodeString::UnicodeString(&this->msg);
  this->partsList = (MessagePatternPartsList *)0x0;
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValuesList = (MessagePatternDoubleList *)0x0;
  this->numericValues = (double *)0x0;
  this->numericValuesLength = 0;
  this->hasArgNames = '\0';
  this->hasArgNumbers = '\0';
  this->needsAutoQuoting = '\0';
  init(this,(EVP_PKEY_CTX *)errorCode);
  return;
}

Assistant:

MessagePattern::MessagePattern(UMessagePatternApostropheMode mode, UErrorCode &errorCode)
        : aposMode(mode),
          partsList(NULL), parts(NULL), partsLength(0),
          numericValuesList(NULL), numericValues(NULL), numericValuesLength(0),
          hasArgNames(FALSE), hasArgNumbers(FALSE), needsAutoQuoting(FALSE) {
    init(errorCode);
}